

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

var cs::eval(context_t *context,string *expr)

{
  bool bVar1;
  element_type *this;
  undefined8 in_RDX;
  proxy *in_RDI;
  char *ch;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  deque<char,_std::allocator<char>_> buff;
  tree_type<cs::token_base_*> tree;
  undefined1 in_stack_0000087f;
  iterator *in_stack_00000880;
  runtime_type *in_stack_00000888;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff38;
  deque<char,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  undefined8 local_88;
  deque<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  charset in_stack_ffffffffffffffac;
  tree_type<cs::token_base_*> *in_stack_ffffffffffffffb0;
  deque<char,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  compiler_type *in_stack_ffffffffffffffc0;
  tree_type<cs::token_base_*> local_20;
  undefined8 local_18;
  
  local_18 = in_RDX;
  tree_type<cs::token_base_*>::tree_type(&local_20);
  std::deque<char,_std::allocator<char>_>::deque((deque<char,_std::allocator<char>_> *)0x5380f3);
  local_88 = local_18;
  local_90._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator*(&local_90);
    std::deque<char,_std::allocator<char>_>::push_back
              (in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_90);
  }
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5381a0);
  std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5381a8);
  compiler_type::build_expr
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffac);
  std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x5381d1);
  this = std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x5381dd);
  tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)this);
  runtime_type::parse_expr(in_stack_00000888,in_stack_00000880,(bool)in_stack_0000087f);
  std::deque<char,_std::allocator<char>_>::~deque(in_stack_ffffffffffffff90);
  tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x53822d);
  return (var)in_RDI;
}

Assistant:

cs::var eval(const context_t &context, const std::string &expr)
	{
		tree_type<cs::token_base *> tree;
		std::deque<char> buff;
		for (auto &ch: expr)
			buff.push_back(ch);
		context->compiler->build_expr(buff, tree);
		return context->instance->parse_expr(tree.root());
	}